

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O0

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  unsigned_short *puVar4;
  uint exponent_00;
  unsigned_short *end_00;
  ushort *puVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  double dVar9;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  StringToDoubleConverter *local_408;
  int local_3fc;
  bool local_3f6;
  bool local_3f4;
  bool local_3f3;
  bool local_3f1;
  double local_3f0;
  double local_3e8;
  Vector<const_char> local_3d8;
  Vector<const_char> local_3c8;
  StringToDoubleConverter *local_3b8;
  double converted;
  char *start;
  bool result_is_junk_1;
  double result_1;
  int digit;
  int num;
  int max_exponent;
  char exponen_sign;
  bool octal;
  double result;
  bool result_is_junk;
  unsigned_short *puStack_378;
  bool leading_zero;
  unsigned_short *next_non_space;
  int local_368;
  bool sign;
  int iStack_364;
  bool nonzero_digit_dropped;
  int insignificant_digits;
  int significant_digits;
  int exponent;
  int buffer_pos;
  char buffer [782];
  int kBufferSize;
  bool allow_spaces_after_sign;
  bool allow_trailing_spaces;
  bool allow_leading_spaces;
  bool allow_trailing_junk;
  unsigned_short *end;
  unsigned_short *current;
  int *processed_characters_count_local;
  bool read_as_double_local;
  unsigned_short *puStack_20;
  int length_local;
  unsigned_short *input_local;
  StringToDoubleConverter *this_local;
  
  end_00 = input + length;
  *processed_characters_count = 0;
  bVar6 = (this->flags_ & 4U) != 0;
  bVar7 = (this->flags_ & 8U) != 0;
  buffer[0x30d] = (this->flags_ & 0x10U) != 0;
  buffer[0x30c] = (this->flags_ & 0x20U) != 0;
  if (input == end_00) {
    return this->empty_string_value_;
  }
  end = input;
  current = (unsigned_short *)processed_characters_count;
  processed_characters_count_local._3_1_ = read_as_double;
  processed_characters_count_local._4_4_ = length;
  puStack_20 = input;
  input_local = (unsigned_short *)this;
  if ((bVar7) || ((bool)buffer[0x30d])) {
    bVar3 = AdvanceToNonspace<unsigned_short_const*>(&end,end_00);
    if (!bVar3) {
      *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
      return this->empty_string_value_;
    }
    if ((!bVar7) && (puStack_20 != end)) {
      return this->junk_string_value_;
    }
  }
  buffer[0x308] = '\x0e';
  buffer[0x309] = '\x03';
  buffer[0x30a] = '\0';
  buffer[0x30b] = '\0';
  significant_digits = 0;
  insignificant_digits = 0;
  iStack_364 = 0;
  local_368 = 0;
  next_non_space._7_1_ = 0;
  next_non_space._6_1_ = 0;
  if ((*end == 0x2b) || (*end == 0x2d)) {
    next_non_space._6_1_ = *end == 0x2d;
    puStack_378 = end + 1;
    end = puStack_378;
    bVar7 = AdvanceToNonspace<unsigned_short_const*>(&stack0xfffffffffffffc88,end_00);
    if (!bVar7) {
      return this->junk_string_value_;
    }
    if (((buffer[0x30c] & 1U) == 0) && (end != puStack_378)) {
      return this->junk_string_value_;
    }
    end = puStack_378;
  }
  if ((this->infinity_symbol_ != (char *)0x0) && ((uint)*end == (int)*this->infinity_symbol_)) {
    bVar7 = ConsumeSubString<unsigned_short_const*>(&end,end_00,this->infinity_symbol_);
    if (!bVar7) {
      return this->junk_string_value_;
    }
    if ((((buffer[0x30d] & 1U) == 0) && (!bVar6)) && (end != end_00)) {
      return this->junk_string_value_;
    }
    if ((!bVar6) && (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&end,end_00), bVar6)) {
      return this->junk_string_value_;
    }
    *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
    if ((next_non_space._6_1_ & 1) == 0) {
      local_3e8 = Double::Infinity();
    }
    else {
      local_3e8 = Double::Infinity();
      local_3e8 = -local_3e8;
    }
    return local_3e8;
  }
  if ((this->nan_symbol_ != (char *)0x0) && ((uint)*end == (int)*this->nan_symbol_)) {
    bVar7 = ConsumeSubString<unsigned_short_const*>(&end,end_00,this->nan_symbol_);
    if (!bVar7) {
      return this->junk_string_value_;
    }
    if ((((buffer[0x30d] & 1U) == 0) && (!bVar6)) && (end != end_00)) {
      return this->junk_string_value_;
    }
    if ((!bVar6) && (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&end,end_00), bVar6)) {
      return this->junk_string_value_;
    }
    *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
    if ((next_non_space._6_1_ & 1) == 0) {
      local_3f0 = Double::NaN();
    }
    else {
      local_3f0 = Double::NaN();
      local_3f0 = -local_3f0;
    }
    return local_3f0;
  }
  result._7_1_ = '\0';
  if (*end == 0x30) {
    puVar4 = end + 1;
    if (puVar4 == end_00) {
      *(int *)current = (int)((long)puVar4 - (long)puStack_20 >> 1);
      end = puVar4;
      dVar9 = SignedZero((bool)(next_non_space._6_1_ & 1));
      return dVar9;
    }
    result._7_1_ = '\x01';
    if (((this->flags_ & 1U) != 0) && ((*puVar4 == 0x78 || (*puVar4 == 0x58)))) {
      end = end + 2;
      if ((end != end_00) && (bVar7 = isDigit((uint)*end,0x10), bVar7)) {
        _max_exponent =
             RadixStringToIeee<4,unsigned_short_const*>
                       (&end,end_00,(bool)(next_non_space._6_1_ & 1),bVar6,this->junk_string_value_,
                        (bool)(processed_characters_count_local._3_1_ & 1),
                        (bool *)((long)&result + 6));
        if ((result._6_1_ & 1) == 0) {
          if ((buffer[0x30d] & 1U) != 0) {
            AdvanceToNonspace<unsigned_short_const*>(&end,end_00);
          }
          *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
        }
        return _max_exponent;
      }
      return this->junk_string_value_;
    }
    while (end = puVar4, *end == 0x30) {
      end = end + 1;
      puVar4 = end;
      if (end == end_00) {
        *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
        dVar9 = SignedZero((bool)(next_non_space._6_1_ & 1));
        return dVar9;
      }
    }
  }
  local_3f1 = false;
  if (result._7_1_ != '\0') {
    local_3f1 = (this->flags_ & 2U) != 0;
  }
  num._3_1_ = local_3f1;
  do {
    uVar1 = *end;
    exponent_00 = (uint)uVar1;
    bVar7 = false;
    if (0x2f < uVar1) {
      bVar7 = *end < 0x3a;
    }
    if (!bVar7) {
      if (iStack_364 == 0) {
        num._3_1_ = false;
      }
      if (*end != 0x2e) goto LAB_002d0f24;
      if (((bool)num._3_1_ != false) && (!bVar6)) {
        return this->junk_string_value_;
      }
      if ((bool)num._3_1_ == false) {
        end = end + 1;
        if (end != end_00) {
          if (iStack_364 == 0) {
            while (*end == 0x30) {
              end = end + 1;
              if (end == end_00) {
                *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
                dVar9 = SignedZero((bool)(next_non_space._6_1_ & 1));
                return dVar9;
              }
              insignificant_digits = insignificant_digits + -1;
            }
          }
          goto LAB_002d0e4b;
        }
        if ((iStack_364 == 0) && (result._7_1_ == '\0')) {
          return this->junk_string_value_;
        }
      }
      break;
    }
    if (iStack_364 < 0x304) {
      uVar1 = CONCAT11((char)(uVar1 >> 8),(char)*end);
      *(char *)((long)&exponent + (long)significant_digits) = (char)*end;
      iStack_364 = iStack_364 + 1;
      significant_digits = significant_digits + 1;
    }
    else {
      local_368 = local_368 + 1;
      local_3f3 = true;
      if ((next_non_space._7_1_ & 1) == 0) {
        local_3f3 = *end != 0x30;
      }
      next_non_space._7_1_ = local_3f3;
    }
    exponent_00 = (uint)uVar1;
    local_3f4 = false;
    if ((bool)num._3_1_ != false) {
      local_3f4 = *end < 0x38;
    }
    num._3_1_ = local_3f4;
    end = end + 1;
  } while (end != end_00);
  goto LAB_002d11e4;
LAB_002d0f24:
  exponent_00 = (uint)uVar1;
  if (((result._7_1_ == '\0') && (insignificant_digits == 0)) && (iStack_364 == 0)) {
    return this->junk_string_value_;
  }
  if ((*end == 0x65) || (uVar2 = (uint)uVar1, *end == 0x45)) {
    if (((bool)num._3_1_ != false) && (!bVar6)) {
      return this->junk_string_value_;
    }
    if ((bool)num._3_1_ != false) goto LAB_002d11e4;
    puVar4 = end + 1;
    if (puVar4 == end_00) {
      end = puVar4;
      if (!bVar6) {
        return this->junk_string_value_;
      }
      goto LAB_002d11e4;
    }
    num._2_1_ = '+';
    if ((*puVar4 == 0x2b) || (*puVar4 == 0x2d)) {
      num._2_1_ = (char)*puVar4;
      puVar4 = end + 2;
      if (puVar4 == end_00) {
        end = puVar4;
        if (!bVar6) {
          return this->junk_string_value_;
        }
        goto LAB_002d11e4;
      }
    }
    end = puVar4;
    if (((end == end_00) || (*end < 0x30)) || (0x39 < *end)) {
      if (!bVar6) {
        return this->junk_string_value_;
      }
      goto LAB_002d11e4;
    }
    digit = 0x3fffffff;
    result_1._4_4_ = 0;
    do {
      result_1._0_4_ = *end - 0x30;
      if ((result_1._4_4_ < 0x6666666) || ((result_1._4_4_ == 0x6666666 && (result_1._0_4_ < 4)))) {
        result_1._4_4_ = result_1._4_4_ * 10 + result_1._0_4_;
      }
      else {
        result_1._4_4_ = 0x3fffffff;
      }
      end = end + 1;
      bVar7 = false;
      puVar5 = end;
      if (end != end_00) {
        puVar5 = (ushort *)(ulong)*end;
        bVar7 = false;
        if (0x2f < *end) {
          bVar7 = *end < 0x3a;
        }
      }
    } while (bVar7);
    if (num._2_1_ == '-') {
      local_3fc = -result_1._4_4_;
    }
    else {
      local_3fc = result_1._4_4_;
    }
    insignificant_digits = local_3fc + insignificant_digits;
    uVar2 = (uint)puVar5;
  }
  exponent_00 = uVar2;
  if ((((buffer[0x30d] & 1U) == 0) && (!bVar6)) && (end != end_00)) {
    return this->junk_string_value_;
  }
  if ((!bVar6) && (bVar7 = AdvanceToNonspace<unsigned_short_const*>(&end,end_00), bVar7)) {
    return this->junk_string_value_;
  }
  if ((buffer[0x30d] & 1U) != 0) {
    AdvanceToNonspace<unsigned_short_const*>(&end,end_00);
  }
  goto LAB_002d11e4;
  while( true ) {
    if (iStack_364 < 0x304) {
      uVar1 = CONCAT11((char)(uVar1 >> 8),(char)*end);
      *(char *)((long)&exponent + (long)significant_digits) = (char)*end;
      iStack_364 = iStack_364 + 1;
      insignificant_digits = insignificant_digits + -1;
      significant_digits = significant_digits + 1;
    }
    else {
      local_3f6 = true;
      if ((next_non_space._7_1_ & 1) == 0) {
        local_3f6 = *end != 0x30;
      }
      next_non_space._7_1_ = local_3f6;
    }
    exponent_00 = (uint)uVar1;
    end = end + 1;
    if (end == end_00) break;
LAB_002d0e4b:
    uVar1 = *end;
    bVar7 = false;
    if (0x2f < uVar1) {
      bVar7 = *end < 0x3a;
    }
    if (!bVar7) goto LAB_002d0f24;
  }
LAB_002d11e4:
  insignificant_digits = local_368 + insignificant_digits;
  if ((num._3_1_ & 1) == 0) {
    if ((next_non_space._7_1_ & 1) != 0) {
      exponent_00 = significant_digits + 1;
      *(undefined1 *)((long)&exponent + (long)significant_digits) = 0x31;
      insignificant_digits = insignificant_digits + -1;
      significant_digits = exponent_00;
    }
    *(undefined1 *)((long)&exponent + (long)significant_digits) = 0;
    if ((processed_characters_count_local._3_1_ & 1) == 0) {
      Vector<const_char>::Vector(&local_3d8,(char *)&exponent,significant_digits);
      buffer_01.start_ = (ulong)(uint)local_3d8.length_;
      buffer_01.length_ = insignificant_digits;
      buffer_01._12_4_ = 0;
      fVar8 = Strtof((double_conversion *)local_3d8.start_,buffer_01,exponent_00);
      local_3b8 = (StringToDoubleConverter *)(double)fVar8;
    }
    else {
      Vector<const_char>::Vector(&local_3c8,(char *)&exponent,significant_digits);
      buffer_00.start_ = (ulong)(uint)local_3c8.length_;
      buffer_00.length_ = insignificant_digits;
      buffer_00._12_4_ = 0;
      local_3b8 = (StringToDoubleConverter *)
                  Strtod((double_conversion *)local_3c8.start_,buffer_00,exponent_00);
    }
    *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
    if ((next_non_space._6_1_ & 1) == 0) {
      local_408 = local_3b8;
    }
    else {
      local_408 = (StringToDoubleConverter *)((ulong)local_3b8 ^ 0x8000000000000000);
    }
    this_local = local_408;
  }
  else {
    converted = (double)&exponent;
    this_local = (StringToDoubleConverter *)
                 RadixStringToIeee<3,char*>
                           ((char **)&converted,(char *)((long)&exponent + (long)significant_digits)
                            ,(bool)(next_non_space._6_1_ & 1),bVar6,this->junk_string_value_,
                            (bool)(processed_characters_count_local._3_1_ & 1),
                            (bool *)((long)&start + 7));
    *(int *)current = (int)((long)end - (long)puStack_20 >> 1);
  }
  return (double)this_local;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}